

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::GoogleTestFailureReporter
          (GoogleTestFailureReporter *this)

{
  GoogleTestFailureReporter *this_local;
  
  FailureReporterInterface::FailureReporterInterface(&this->super_FailureReporterInterface);
  (this->super_FailureReporterInterface)._vptr_FailureReporterInterface =
       (_func_int **)&PTR__GoogleTestFailureReporter_003024f8;
  return;
}

Assistant:

void ReportFailure(FailureType type, const char* file, int line,
                     const std::string& message) override {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }